

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDiscardTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::ShaderDiscardTests::init(ShaderDiscardTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  allocator<char> local_140 [32];
  ShaderDiscardTests *local_120;
  undefined8 local_118;
  TestContext *local_108;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string description;
  string name;
  StringTemplate shaderTemplate;
  
  local_118 = 0;
  local_108 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_120 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&params,
             "#version 310 es\nlayout(location = 0) in mediump vec4 v_color;\nlayout(location = 1) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nlayout(set = 0, binding = 2) uniform sampler2D    ut_brick;\nlayout(set = 0, binding = 0) uniform block0 { mediump int  ui_one; };\n\nvoid main (void)\n{\n    o_color = v_color;\n    ${DISCARD};\n}\n"
             ,local_140);
  tcu::StringTemplate::StringTemplate(&shaderTemplate,(string *)&params);
  std::__cxx11::string::~string((string *)&params);
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1 = (*(code *)&LAB_0059c95d)();
  return iVar1;
}

Assistant:

void ShaderDiscardTests::init (void)
{
	for (int tmpl = 0; tmpl < DISCARDTEMPLATE_LAST; tmpl++)
		for (int mode = 0; mode < DISCARDMODE_LAST; mode++)
			addChild(makeDiscardCase(m_testCtx, (DiscardTemplate)tmpl, (DiscardMode)mode).release());
}